

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

_Bool rsa1_encrypted_f(Filename *filename,char **comment)

{
  int iVar1;
  LoadedFile *lf;
  _Bool _Var2;
  char *dummy;
  char *local_20;
  
  _Var2 = false;
  lf = lf_load_keyfile(filename,(char **)0x0);
  if (lf != (LoadedFile *)0x0) {
    iVar1 = rsa1_load_s_internal
                      (lf->binarysource_,(RSAKey *)0x0,false,comment,(char *)0x0,&local_20);
    _Var2 = iVar1 == 1;
    lf_free(lf);
  }
  return _Var2;
}

Assistant:

bool rsa1_encrypted_f(const Filename *filename, char **comment)
{
    LoadedFile *lf = lf_load_keyfile(filename, NULL);
    if (!lf)
        return false; /* couldn't even open the file */

    bool toret = rsa1_encrypted_s(BinarySource_UPCAST(lf), comment);
    lf_free(lf);
    return toret;
}